

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O3

bool wasm::Match::Internal::
     Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
     ::match(matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
             candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
            *matchers)

{
  BinaryOp BVar1;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> pBVar2;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  *pMVar3;
  matched_t<wasm::Const_*> pCVar4;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *pMVar5;
  matched_t<wasm::Const_*> *ppCVar6;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *ppEVar7;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *pMVar8;
  bool bVar9;
  BinaryOp BVar10;
  Literal local_48;
  
  pBVar2 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
            )candidate->left;
  if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
  {
    pMVar3 = matchers->curr;
    if (pMVar3->binder !=
        (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> *
        )0x0) {
      *pMVar3->binder = pBVar2;
    }
    BVar1 = pBVar2->op;
    BVar10 = Abstract::getBinary((Type)(pBVar2->left->type).id,pMVar3->data);
    if ((BVar1 == BVar10) &&
       (pCVar4 = (matched_t<wasm::Const_*>)pBVar2->left,
       (pCVar4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id == ConstId)
       ) {
      pMVar5 = (pMVar3->submatchers).curr;
      ppCVar6 = pMVar5->binder;
      if (ppCVar6 != (matched_t<wasm::Const_*> *)0x0) {
        *ppCVar6 = pCVar4;
      }
      Literal::Literal(&local_48,&pCVar4->value);
      bVar9 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
              ::matches(&(pMVar5->submatchers).curr,&local_48);
      Literal::~Literal(&local_48);
      if (bVar9) {
        ppEVar7 = ((pMVar3->submatchers).next.curr)->binder;
        if (ppEVar7 != (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
          *ppEVar7 = pBVar2->right;
        }
        pCVar4 = (matched_t<wasm::Const_*>)candidate->right;
        if ((pCVar4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id ==
            ConstId) {
          pMVar8 = (matchers->next).curr;
          ppCVar6 = pMVar8->binder;
          if (ppCVar6 != (matched_t<wasm::Const_*> *)0x0) {
            *ppCVar6 = pCVar4;
          }
          Literal::Literal(&local_48,&pCVar4->value);
          bVar9 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                  ::matches(&(pMVar8->submatchers).curr,&local_48);
          Literal::~Literal(&local_48);
          return bVar9;
        }
      }
    }
  }
  return false;
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }